

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O3

int Dau_DsdPerform_rec(word t,char *pBuffer,int Pos,int *pVars,int nVars)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint nVars_00;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  word t_00;
  int iVar16;
  ulong uVar17;
  int pVarsNew [6];
  char pNest [10];
  word Cof1 [6];
  word Cof0 [6];
  uint local_e8 [6];
  char *local_d0;
  ulong local_c8;
  ulong local_c0;
  char local_b2 [10];
  ulong local_a8;
  ulong local_a0;
  ulong auStack_98 [6];
  ulong auStack_68 [7];
  
  if (1999 < Pos) {
    __assert_fail("Pos < DAU_MAX_STR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                  ,0x2a7,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
  }
  if (0 < nVars) {
    uVar14 = 0;
    nVars_00 = 0;
    do {
      uVar1 = pVars[uVar14];
      if ((s_Truths6Neg[(int)uVar1] & (t >> ((byte)(1L << ((byte)uVar1 & 0x3f)) & 0x3f) ^ t)) != 0)
      {
        lVar6 = (long)(int)nVars_00;
        nVars_00 = nVars_00 + 1;
        local_e8[lVar6] = uVar1;
      }
      uVar14 = uVar14 + 1;
    } while ((uint)nVars != uVar14);
    if (0 < (int)nVars_00) {
      if (nVars_00 == 1) {
        if (s_Truths6[(int)local_e8[0]] == t) {
          iVar16 = Pos + 1;
          pBuffer[Pos] = (char)local_e8[0] + 'a';
        }
        else {
          if ((s_Truths6[(int)local_e8[0]] ^ t) != 0xffffffffffffffff) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                          ,700,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
          }
          pBuffer[Pos] = '!';
          iVar16 = Pos + 2;
          pBuffer[(long)Pos + 1] = (char)local_e8[0] + 'a';
        }
      }
      else {
        uVar14 = (ulong)nVars_00;
        uVar15 = 0;
        do {
          uVar10 = (ulong)local_e8[uVar15];
          if (5 < uVar10) {
LAB_00509a01:
            __assert_fail("iVar >= 0 && iVar < 6",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x337,"word Abc_Tt6Cofactor0(word, int)");
          }
          bVar5 = (byte)local_e8[uVar15];
          bVar3 = (byte)(1L << (bVar5 & 0x3f));
          uVar7 = (s_Truths6Neg[uVar10] & t) << (bVar3 & 0x3f) | s_Truths6Neg[uVar10] & t;
          uVar10 = s_Truths6[uVar10];
          auStack_68[uVar15] = uVar7;
          uVar10 = (uVar10 & t) >> (bVar3 & 0x3f) | uVar10 & t;
          auStack_98[uVar15] = uVar10;
          if (uVar7 == uVar10) {
            __assert_fail("Cof0[v] != Cof1[v]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                          ,0x2c4,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
          }
          if (uVar7 == 0xffffffffffffffff) {
            (pBuffer + Pos)[0] = '!';
            (pBuffer + Pos)[1] = '(';
            iVar4 = Pos + 3;
            pBuffer[(long)Pos + 2] = bVar5 + 0x61;
            uVar7 = ~uVar10;
LAB_005097c2:
            iVar4 = Dau_DsdPerform_rec(uVar7,pBuffer,iVar4,(int *)local_e8,nVars_00);
            pBuffer[iVar4] = ')';
            return iVar4 + 1;
          }
          if (uVar7 == 0) {
            pBuffer[Pos] = '(';
            iVar4 = Pos + 2;
            pBuffer[(long)Pos + 1] = bVar5 + 0x61;
            uVar7 = uVar10;
            goto LAB_005097c2;
          }
          if (uVar10 == 0xffffffffffffffff) {
            (pBuffer + Pos)[0] = '!';
            (pBuffer + Pos)[1] = '(';
            pBuffer[(long)Pos + 2] = '!';
            iVar4 = Pos + 4;
            pBuffer[(long)Pos + 3] = bVar5 + 0x61;
            uVar7 = ~uVar7;
            goto LAB_005097c2;
          }
          if (uVar10 == 0) {
            (pBuffer + Pos)[0] = '(';
            (pBuffer + Pos)[1] = '!';
            iVar4 = Pos + 3;
            pBuffer[(long)Pos + 2] = bVar5 + 0x61;
            goto LAB_005097c2;
          }
          if ((uVar10 ^ uVar7) == 0xffffffffffffffff) {
            pBuffer[Pos] = '[';
            pBuffer[(long)Pos + 1] = bVar5 + 0x61;
            iVar4 = Dau_DsdPerform_rec(uVar7,pBuffer,Pos + 2,(int *)local_e8,nVars_00);
            pBuffer[iVar4] = ']';
            return iVar4 + 1;
          }
          uVar15 = uVar15 + 1;
        } while (uVar14 != uVar15);
        local_d0 = pBuffer;
        uVar10 = 1;
        uVar15 = 0;
        do {
          local_c8 = uVar15;
          local_a8 = uVar15 + 1;
          local_a0 = uVar10;
          uVar7 = uVar10;
          if (local_a8 < uVar14) {
            do {
              uVar1 = local_e8[uVar7];
              uVar11 = (ulong)uVar1;
              if (5 < uVar11) goto LAB_00509a01;
              uVar17 = s_Truths6Neg[uVar11] & auStack_68[uVar15];
              bVar3 = (byte)(1L << ((byte)uVar1 & 0x3f));
              local_c0 = uVar11;
              uVar8 = auStack_68[uVar15] & s_Truths6[uVar11];
              uVar13 = s_Truths6Neg[uVar11] & auStack_98[uVar15];
              uVar17 = uVar17 << (bVar3 & 0x3f) | uVar17;
              uVar9 = auStack_98[uVar15] & s_Truths6[uVar11];
              uVar8 = uVar8 >> (bVar3 & 0x3f) | uVar8;
              uVar13 = uVar13 << (bVar3 & 0x3f) | uVar13;
              uVar9 = uVar9 >> (bVar3 & 0x3f) | uVar9;
              if ((uVar17 == uVar8) && (uVar17 == uVar13)) {
                sprintf(local_b2,"(%c%c)",(ulong)(local_e8[uVar15] + 0x61),(ulong)(uVar1 + 0x61));
                pcVar12 = local_d0;
                iVar4 = Dau_DsdPerform_rec((uVar9 ^ uVar17) & s_Truths6[uVar11] ^ uVar17,local_d0,
                                           Pos,(int *)local_e8,nVars_00);
                goto LAB_005099f4;
              }
              if ((uVar17 == uVar8) && (uVar17 == uVar9)) {
                sprintf(local_b2,"(%c!%c)",(ulong)(local_e8[uVar15] + 0x61),(ulong)(uVar1 + 0x61));
                pcVar12 = local_d0;
                iVar4 = Dau_DsdPerform_rec((uVar13 ^ uVar17) & s_Truths6[uVar11] ^ uVar17,local_d0,
                                           Pos,(int *)local_e8,nVars_00);
                goto LAB_005099f4;
              }
              if ((uVar17 == uVar13) && (uVar17 == uVar9)) {
                uVar2 = local_e8[uVar15];
                pcVar12 = "(!%c%c)";
LAB_0050999f:
                sprintf(local_b2,pcVar12,(ulong)(uVar2 + 0x61),(ulong)(uVar1 + 0x61));
                t_00 = (uVar8 ^ uVar17) & s_Truths6[uVar11] ^ uVar17;
LAB_005099cf:
                pcVar12 = local_d0;
                iVar4 = Dau_DsdPerform_rec(t_00,local_d0,Pos,(int *)local_e8,nVars_00);
LAB_005099f4:
                iVar4 = Dau_DsdPerformReplace(pcVar12,Pos,iVar4,uVar1 + 0x61,local_b2);
                return iVar4;
              }
              if ((uVar8 == uVar13) && (uVar8 == uVar9)) {
                sprintf(local_b2,"(!%c!%c)",(ulong)(local_e8[uVar15] + 0x61),(ulong)(uVar1 + 0x61));
                t_00 = (uVar17 ^ uVar8) & s_Truths6[uVar11] ^ uVar8;
                goto LAB_005099cf;
              }
              if ((uVar17 == uVar9) && (uVar8 == uVar13)) {
                uVar2 = local_e8[uVar15];
                pcVar12 = "[%c%c]";
                goto LAB_0050999f;
              }
              uVar7 = uVar7 + 1;
            } while (uVar14 != uVar7);
          }
          uVar10 = uVar10 + 1;
          uVar15 = local_a8;
        } while (local_a8 != uVar14);
        uVar15 = 0xffffffff;
        iVar4 = 10;
        uVar10 = 0;
        do {
          uVar7 = 0;
          iVar16 = 0;
          do {
            if (uVar10 != uVar7) {
              bVar3 = (byte)(1L << ((byte)local_e8[uVar7] & 0x3f));
              if (((auStack_68[uVar10] >> (bVar3 & 0x3f) ^ auStack_68[uVar10]) &
                  s_Truths6Neg[(int)local_e8[uVar7]]) != 0) {
                iVar16 = (iVar16 + 1) -
                         (uint)(((auStack_98[uVar10] >> (bVar3 & 0x3f) ^ auStack_98[uVar10]) &
                                s_Truths6Neg[(int)local_e8[uVar7]]) == 0);
              }
            }
            uVar7 = uVar7 + 1;
          } while (uVar14 != uVar7);
          if (iVar16 < iVar4) {
            uVar15 = uVar10 & 0xffffffff;
          }
          if (iVar16 == 0) break;
          if (iVar16 <= iVar4) {
            iVar4 = iVar16;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar14);
        pBuffer[Pos] = '<';
        iVar16 = (int)uVar15;
        pBuffer[(long)Pos + 1] = (char)local_e8[iVar16] + 'a';
        iVar4 = Dau_DsdPerform_rec(auStack_98[iVar16],pBuffer,Pos + 2,(int *)local_e8,nVars_00);
        iVar4 = Dau_DsdPerform_rec(auStack_68[iVar16],pBuffer,iVar4,(int *)local_e8,nVars_00);
        iVar16 = iVar4 + 1;
        pBuffer[iVar4] = '>';
      }
      return iVar16;
    }
  }
  __assert_fail("nVarsNew > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dau/dauDsd.c"
                ,0x2ad,"int Dau_DsdPerform_rec(word, char *, int, int *, int)");
}

Assistant:

int Dau_DsdPerform_rec( word t, char * pBuffer, int Pos, int * pVars, int nVars )
{
    char pNest[10];
    word Cof0[6], Cof1[6], Cof[4];
    int pVarsNew[6], nVarsNew, PosStart;
    int v, u, vBest, CountBest;
    assert( Pos < DAU_MAX_STR );
    // perform support minimization
    nVarsNew = 0;
    for ( v = 0; v < nVars; v++ )
        if ( Abc_Tt6HasVar( t, pVars[v] ) )
            pVarsNew[ nVarsNew++ ] = pVars[v];
    assert( nVarsNew > 0 );
    // special case when function is a var
    if ( nVarsNew == 1 )
    {
        if ( t == s_Truths6[ pVarsNew[0] ] )
        {
            pBuffer[Pos++] = 'a' +  pVarsNew[0];
            return Pos;
        }
        if ( t == ~s_Truths6[ pVarsNew[0] ] )
        {
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = 'a' +  pVarsNew[0];
            return Pos;
        }
        assert( 0 );
        return Pos;
    }
    // decompose on the output side
    for ( v = 0; v < nVarsNew; v++ )
    {
        Cof0[v] = Abc_Tt6Cofactor0( t, pVarsNew[v] );
        Cof1[v] = Abc_Tt6Cofactor1( t, pVarsNew[v] );
        assert( Cof0[v] != Cof1[v] );
        if ( Cof0[v] == 0 ) // ax
        {
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( Cof1[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof0[v] == ~(word)0 ) // !(ax)
        {
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( ~Cof1[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof1[v] == 0 ) // !ax
        {
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( Cof0[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof1[v] == ~(word)0 ) // !(!ax)
        {
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = '(';
            pBuffer[Pos++] = '!';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( ~Cof0[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ')';
            return Pos;
        }
        if ( Cof0[v] == ~Cof1[v] ) // a^x
        {
            pBuffer[Pos++] = '[';
            pBuffer[Pos++] = 'a' + pVarsNew[v];
            Pos = Dau_DsdPerform_rec( Cof0[v], pBuffer, Pos, pVarsNew, nVarsNew );
            pBuffer[Pos++] = ']';
            return Pos;
        }
    }
    // decompose on the input side
    for ( v = 0; v < nVarsNew; v++ )
    for ( u = v+1; u < nVarsNew; u++ )
    {
        Cof[0] = Abc_Tt6Cofactor0( Cof0[v], pVarsNew[u] );
        Cof[1] = Abc_Tt6Cofactor1( Cof0[v], pVarsNew[u] );
        Cof[2] = Abc_Tt6Cofactor0( Cof1[v], pVarsNew[u] );
        Cof[3] = Abc_Tt6Cofactor1( Cof1[v], pVarsNew[u] );
        if ( Cof[0] == Cof[1] && Cof[0] == Cof[2] ) // vu
        {
            PosStart = Pos;
            sprintf( pNest, "(%c%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[3]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[0] == Cof[1] && Cof[0] == Cof[3] ) // v!u
        {
            PosStart = Pos;
            sprintf( pNest, "(%c!%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[2]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[0] == Cof[2] && Cof[0] == Cof[3] ) // !vu
        {
            PosStart = Pos;
            sprintf( pNest, "(!%c%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[1]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[1] == Cof[2] && Cof[1] == Cof[3] ) // !v!u
        {
            PosStart = Pos;
            sprintf( pNest, "(!%c!%c)", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[0]) | (~s_Truths6[pVarsNew[u]] & Cof[1]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
        if ( Cof[0] == Cof[3] && Cof[1] == Cof[2] ) // v+u
        {
            PosStart = Pos;
            sprintf( pNest, "[%c%c]", 'a' + pVarsNew[v], 'a' + pVarsNew[u] );
            Pos = Dau_DsdPerform_rec( (s_Truths6[pVarsNew[u]] & Cof[1]) | (~s_Truths6[pVarsNew[u]] & Cof[0]), pBuffer, Pos, pVarsNew, nVarsNew );
            Pos = Dau_DsdPerformReplace( pBuffer, PosStart, Pos, 'a' + pVarsNew[u], pNest );
            return Pos;
        }
    } 
    // find best variable for MUX decomposition
    vBest = -1;
    CountBest = 10;
    for ( v = 0; v < nVarsNew; v++ )
    {
        int CountCur = 0;
        for ( u = 0; u < nVarsNew; u++ )
            if ( u != v && Abc_Tt6HasVar(Cof0[v], pVarsNew[u]) && Abc_Tt6HasVar(Cof1[v], pVarsNew[u]) )
                CountCur++;
        if ( CountBest > CountCur )
        {
            CountBest = CountCur;
            vBest = v;
        }
        if ( CountCur == 0 )
            break;
    }
    // perform MUX decomposition
    pBuffer[Pos++] = '<';
    pBuffer[Pos++] = 'a' + pVarsNew[vBest];
    Pos = Dau_DsdPerform_rec( Cof1[vBest], pBuffer, Pos, pVarsNew, nVarsNew );
    Pos = Dau_DsdPerform_rec( Cof0[vBest], pBuffer, Pos, pVarsNew, nVarsNew );
    pBuffer[Pos++] = '>';
    return Pos;
}